

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

Iterator * __thiscall leveldb::Block::NewIterator(Block *this,Comparator *comparator)

{
  uint32_t uVar1;
  Comparator *in_RDI;
  long in_FS_OFFSET;
  uint32_t num_restarts;
  Slice *in_stack_ffffffffffffff68;
  Slice *in_stack_ffffffffffffff70;
  Block *in_stack_ffffffffffffff78;
  Status *status;
  undefined8 in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffac;
  Iterator *local_38;
  Status local_30 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI[1]._vptr_Comparator < (_func_int **)0x4) {
    Slice::Slice((Slice *)in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
    status = local_30;
    Slice::Slice(in_stack_ffffffffffffff68);
    Status::Corruption(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_38 = NewErrorIterator(status);
    Status::~Status((Status *)in_stack_ffffffffffffff68);
  }
  else {
    uVar1 = NumRestarts(in_stack_ffffffffffffff78);
    if (uVar1 == 0) {
      local_38 = NewEmptyIterator();
    }
    else {
      local_38 = (Iterator *)operator_new(0x80);
      Iter::Iter((Iter *)CONCAT44(in_stack_ffffffffffffffac,uVar1),in_RDI,in_stack_ffffffffffffff98,
                 (uint32_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                 (uint32_t)in_stack_ffffffffffffff90);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_38;
  }
  __stack_chk_fail();
}

Assistant:

Iterator* Block::NewIterator(const Comparator* comparator) {
  if (size_ < sizeof(uint32_t)) {
    return NewErrorIterator(Status::Corruption("bad block contents"));
  }
  const uint32_t num_restarts = NumRestarts();
  if (num_restarts == 0) {
    return NewEmptyIterator();
  } else {
    return new Iter(comparator, data_, restart_offset_, num_restarts);
  }
}